

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-kalman-filter-template.cpp
# Opt level: O0

double testExtendedKalmanFilterLTV(void)

{
  Scalar SVar1;
  Scalar *pSVar2;
  Scalar *pSVar3;
  Scalar *pSVar4;
  result_type rVar5;
  RealScalar RVar6;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0> PVar7;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar8;
  double *pdStack_12d28;
  Matrix<double,_3,_1,_0,_3,_1> *pMStack_12d10;
  double *pdStack_12cf8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  CStack_12cf0;
  Matrix<double,4,1,0,4,1> aMStack_12cd8 [8];
  StateVector error;
  undefined1 auStack_12c98 [8];
  Cmatrix c;
  Amatrix a_1;
  uint uStack_12bac;
  double dStack_12ba8;
  uint i;
  Scalar SStack_12ba0;
  ConstantReturnType CStack_12b98;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  CStack_12b88;
  undefined1 auStack_12b58 [8];
  StateVector dx;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
  PStack_12b30;
  uint uStack_12b1c;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  aEStack_12b18 [4];
  uint i_3;
  undefined1 auStack_12b08 [8];
  Pmatrix p;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
  aEStack_12a7b [3];
  undefined1 auStack_12a78 [8];
  StateVector xh;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  CStack_12a40;
  StateVector SStack_12a28;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>
  CStack_12a00;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
  aDStack_129e3 [3];
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  PStack_129e0;
  double dStack_129d0;
  double dStack_129c8;
  undefined1 auStack_129c0 [8];
  normal_distribution<double> g_1;
  undefined1 auStack_129a8 [4];
  uint i_2;
  MeasureVector w;
  double dStack_12980;
  double dStack_12978;
  undefined1 auStack_12970 [8];
  normal_distribution<double> g;
  undefined1 auStack_12958 [4];
  uint i_1;
  StateVector v;
  uint k;
  Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>
  PStack_12928;
  undefined1 auStack_12918 [8];
  Qmatrix q;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_0>
  PStack_12890;
  undefined1 auStack_12880 [8];
  Rmatrix r;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
  aMStack_1282b [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
  CStack_12828;
  Matrix<double,4,4,0,4,4> aMStack_12808 [8];
  Qmatrix q1;
  double dStack_12780;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  aMStack_12773 [3];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  CStack_12770;
  Matrix<double,3,3,0,3,3> aMStack_12750 [8];
  Rmatrix r1;
  lagged_fibonacci1279 gen_;
  undefined1 local_fef8 [8];
  StateVector x;
  InputVector uk [1001];
  undefined1 local_df88 [8];
  MeasureVector yk [1000];
  StateVector xk [1001];
  KalmanFunctorLTV func;
  undefined1 local_418 [8];
  Amatrix a;
  ekf f;
  
  stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::ExtendedKalmanFilter
            ((ExtendedKalmanFilter<4U,_3U,_1U> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),true);
  Eigen::Matrix<double,_4,_4,_0,_4,_4>::Matrix((Matrix<double,_4,_4,_0,_4,_4> *)local_418);
  testExtendedKalmanFilterLTV::KalmanFunctorLTV::KalmanFunctorLTV
            ((KalmanFunctorLTV *)
             (xk[1000].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array + 3));
  stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::setFunctor
            ((ExtendedKalmanFilter<4U,_3U,_1U> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(DynamicsFunctorBase *)
                    (xk[1000].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                     .m_data.array + 3));
  pdStack_12cf8 =
       yk[999].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array +
       2;
  do {
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)pdStack_12cf8);
    pdStack_12cf8 = pdStack_12cf8 + 4;
  } while (pdStack_12cf8 !=
           xk[1000].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
           array + 3);
  pMStack_12d10 = (Matrix<double,_3,_1,_0,_3,_1> *)local_df88;
  do {
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(pMStack_12d10);
    pMStack_12d10 = pMStack_12d10 + 1;
  } while (pMStack_12d10 !=
           (Matrix<double,_3,_1,_0,_3,_1> *)
           (yk[999].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
            array + 2));
  pdStack_12d28 =
       x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array + 3;
  do {
    Eigen::Matrix<double,_1,_1,_0,_1,_1>::Matrix((Matrix<double,_1,_1,_0,_1,_1> *)pdStack_12d28);
    pdStack_12d28 = pdStack_12d28 + 1;
  } while ((InputVector *)pdStack_12d28 != uk + 1000);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Zero();
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
            ((Matrix<double,4,1,0,4,1> *)local_fef8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
              *)(gen_.x + 0x4fe));
  boost::random::lagged_fibonacci_01_engine<double,_48,_1279U,_418U>::lagged_fibonacci_01_engine
            ((lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
             (r1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
             + 8));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Random();
  dStack_12780 = 0.01;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
  ::operator*(&CStack_12770,aMStack_12773,&dStack_12780);
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,3,3,0,3,3>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>const>>
            (aMStack_12750,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
              *)&CStack_12770);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Random();
  r.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 0.01;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
  ::operator*(&CStack_12828,aMStack_1282b,
              r.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
              + 8);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,4,0,4,4>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>const>const>>
            (aMStack_12808,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>_>
              *)&CStack_12828);
  q.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0xf] =
       (double)Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)aMStack_12750);
  PStack_12890 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)aMStack_12750,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
                            (q.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                             m_storage.m_data.array + 0xf));
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>,0>>
            ((Matrix<double,3,3,0,3,3> *)auStack_12880,&PStack_12890);
  _k = Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)aMStack_12808);
  PStack_12928 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)aMStack_12808,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                            &k);
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::Product<Eigen::Matrix<double,4,4,0,4,4>,Eigen::Transpose<Eigen::Matrix<double,4,4,0,4,4>>,0>>
            ((Matrix<double,4,4,0,4,4> *)auStack_12918,&PStack_12928);
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
            ((Matrix<double,_4,_1,_0,_4,_1> *)
             (yk[999].super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),(Matrix<double,_4,_1,_0,_4,_1> *)local_fef8);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::Random();
  Eigen::Matrix<double,1,1,0,1,1>::operator=
            ((Matrix<double,1,1,0,1,1> *)
             (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
             + 3),(DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                   *)((long)v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage
                            .m_data.array + 0x1d));
  for (v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3].
       _0_4_ = 1;
      v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]._0_4_
      < 0x3e9; v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               [3]._0_4_ = v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3]._0_4_ + 1) {
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)auStack_12958);
    for (g._sigma._4_4_ = 0; g._sigma._4_4_ < 4; g._sigma._4_4_ = g._sigma._4_4_ + 1) {
      dStack_12978 = 0.0;
      dStack_12980 = 1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)auStack_12970,&dStack_12978,&dStack_12980);
      rVar5 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)auStack_12970,
                         (lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
                         (r1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 8));
      pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)auStack_12958,
                          (ulong)g._sigma._4_4_);
      *pSVar2 = rVar5;
    }
    PVar7 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)aMStack_12808,
                       (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)auStack_12958);
    w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (double)PVar7.m_lhs;
    Eigen::Matrix<double,4,1,0,4,1>::operator=
              ((Matrix<double,4,1,0,4,1> *)auStack_12958,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_0>_>
                *)(w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 2));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)auStack_129a8);
    for (g_1._sigma._4_4_ = 0; g_1._sigma._4_4_ < 3; g_1._sigma._4_4_ = g_1._sigma._4_4_ + 1) {
      dStack_129c8 = 0.0;
      dStack_129d0 = 1.0;
      boost::random::normal_distribution<double>::normal_distribution
                ((normal_distribution<double> *)auStack_129c0,&dStack_129c8,&dStack_129d0);
      rVar5 = boost::random::normal_distribution<double>::operator()
                        ((normal_distribution<double> *)auStack_129c0,
                         (lagged_fibonacci_01_engine<double,_48,_1279U,_418U> *)
                         (r1.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 8));
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)auStack_129a8,
                          (ulong)g_1._sigma._4_4_);
      *pSVar3 = rVar5;
    }
    PVar8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)aMStack_12750,
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_129a8);
    PStack_129e0 = PVar8;
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)auStack_129a8,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)&PStack_129e0);
    Eigen::DenseBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>::Random();
    Eigen::Matrix<double,1,1,0,1,1>::operator=
              ((Matrix<double,1,1,0,1,1> *)
               (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + (ulong)v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[3]._0_4_ + 3),aDStack_129e3);
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::stateDynamics(Eigen::
    Matrix<double,4,1,0,4,1>const&,Eigen::Matrix<double,1,1,0,1,1>_const__unsigned_int_
              (&SStack_12a28,
               xk[1000].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array + 3,(StateVector *)local_fef8,
               (InputVector *)
               (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + (ulong)(v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                                m_storage.m_data.array[3]._0_4_ - 1) + 3),
               v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               [3]._0_4_ - 1);
    Eigen::MatrixBase<Eigen::Matrix<double,4,1,0,4,1>>::operator+
              (&CStack_12a00,(MatrixBase<Eigen::Matrix<double,4,1,0,4,1>> *)&SStack_12a28,
               (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)auStack_12958);
    Eigen::Matrix<double,4,1,0,4,1>::operator=
              ((Matrix<double,4,1,0,4,1> *)local_fef8,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>
                *)&CStack_12a00);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)
               (xk[(ulong)v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                          m_data.array[3]._0_4_ - 1].
                super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               + 3),(Matrix<double,_4,_1,_0,_4,_1> *)local_fef8);
    testExtendedKalmanFilterLTV()::KalmanFunctorLTV::measureDynamics(Eigen::
    Matrix<double,4,1,0,4,1>const&,Eigen::Matrix<double,1,1,0,1,1>_const__unsigned_int_
              ((MeasureVector *)
               (xh.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),
               xk[1000].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
               m_data.array + 3,(StateVector *)local_fef8,
               (InputVector *)
               (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + (ulong)v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                               m_storage.m_data.array[3]._0_4_ + 3),
               v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array
               [3]._0_4_);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (&CStack_12a40,
               (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (xh.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)auStack_129a8);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (yk[(ulong)(v.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                           m_data.array[3]._0_4_ - 1) - 1].
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               + 2),(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)&CStack_12a40);
  }
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Random();
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_random_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
            ((Matrix<double,4,1,0,4,1> *)auStack_12a78,aEStack_12a7b);
  stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setState
            ((ZeroDelayObserver<4U,_3U,_1U> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(StateVector *)auStack_12a78,0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::Zero();
  Eigen::Matrix<double,4,4,0,4,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,4,0,4,4>>>
            ((Matrix<double,4,4,0,4,4> *)auStack_12b08,aEStack_12b18);
  stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setStateCovariance
            ((KalmanFilterBase<4U,_3U,_1U> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(Pmatrix *)auStack_12b08);
  stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setR
            ((KalmanFilterBase<4U,_3U,_1U> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(Rmatrix *)auStack_12880);
  stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setQ
            ((KalmanFilterBase<4U,_3U,_1U> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(Qmatrix *)auStack_12918);
  stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setInput
            ((ZeroDelayObserver<4U,_3U,_1U> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf),(InputVector *)
                    (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
                     .array + 3),0);
  for (uStack_12b1c = 0; uStack_12b1c < 4; uStack_12b1c = uStack_12b1c + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)auStack_12a78,
                        (ulong)uStack_12b1c);
    SVar1 = *pSVar2;
    pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_1> *)auStack_12b08,
                        (ulong)uStack_12b1c,(ulong)uStack_12b1c);
    *pSVar4 = SVar1;
  }
  dx.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3] =
       (double)Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>::transpose
                         ((DenseBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_> *)auStack_12b08);
  PStack_12b30 = Eigen::MatrixBase<Eigen::Matrix<double,4,4,0,4,4>>::operator*
                           ((MatrixBase<Eigen::Matrix<double,4,4,0,4,4>> *)auStack_12b08,
                            (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_> *)
                            (dx.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                             m_storage.m_data.array + 3));
  Eigen::Matrix<double,4,4,0,4,4>::operator=
            ((Matrix<double,4,4,0,4,4> *)auStack_12b08,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_4,_4,_0,_4,_4>,_Eigen::Transpose<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>,_0>_>
              *)&PStack_12b30);
  SStack_12ba0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::Constant(&CStack_12b98,&SStack_12ba0);
  dStack_12ba8 = 1e-08;
  Eigen::
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
  ::operator*(&CStack_12b88,
              (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>>
               *)&CStack_12b98,&stack0xfffffffffffed458);
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,1,0,4,1>const>const>>
            ((Matrix<double,4,1,0,4,1> *)auStack_12b58,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
              *)&CStack_12b88);
  for (uStack_12bac = 1; uStack_12bac < 0x3e9; uStack_12bac = uStack_12bac + 1) {
    stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setMeasurement
              ((ZeroDelayObserver<4U,_3U,_1U> *)
               (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),
               (MeasureVector *)
               (yk[(ulong)(uStack_12bac - 1) - 1].
                super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               + 2),uStack_12bac);
    stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::setInput
              ((ZeroDelayObserver<4U,_3U,_1U> *)
               (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),
               (InputVector *)
               (x.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + (ulong)uStack_12bac + 3),uStack_12bac);
    stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::getAMatrixFD
              ((Amatrix *)
               (c.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
                array + 0xb),
               (ExtendedKalmanFilter<4U,_3U,_1U> *)
               (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),(StateVector *)auStack_12b58);
    stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::getCMatrixFD
              ((Cmatrix *)auStack_12c98,
               (ExtendedKalmanFilter<4U,_3U,_1U> *)
               (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),(StateVector *)auStack_12b58);
    stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setA
              ((KalmanFilterBase<4U,_3U,_1U> *)
               (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),
               (Amatrix *)
               (c.super_PlainObjectBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>.m_storage.m_data.
                array + 0xb));
    stateObservation::compileTime::KalmanFilterBase<4U,_3U,_1U>::setC
              ((KalmanFilterBase<4U,_3U,_1U> *)
               (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),(Cmatrix *)auStack_12c98);
    stateObservation::compileTime::ZeroDelayObserver<4U,_3U,_1U>::getEstimatedState
              ((StateVector *)
               (error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3),
               (ZeroDelayObserver<4U,_3U,_1U> *)
               (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
                array + 0xf),uStack_12bac);
    Eigen::Matrix<double,_4,_1,_0,_4,_1>::operator=
              ((Matrix<double,_4,_1,_0,_4,_1> *)auStack_12a78,
               (Matrix<double,_4,_1,_0,_4,_1> *)
               (error.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
                array + 3));
  }
  Eigen::MatrixBase<Eigen::Matrix<double,4,1,0,4,1>>::operator-
            (&CStack_12cf0,(MatrixBase<Eigen::Matrix<double,4,1,0,4,1>> *)auStack_12a78,
             (MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
             (xk[999].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.
              array + 3));
  Eigen::Matrix<double,4,1,0,4,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,4,1,0,4,1>const,Eigen::Matrix<double,4,1,0,4,1>const>>
            (aMStack_12cd8,&CStack_12cf0);
  RVar6 = Eigen::MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::norm
                    ((MatrixBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)aMStack_12cd8);
  testExtendedKalmanFilterLTV::KalmanFunctorLTV::~KalmanFunctorLTV
            ((KalmanFunctorLTV *)
             (xk[1000].super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data
              .array + 3));
  stateObservation::compileTime::ExtendedKalmanFilter<4U,_3U,_1U>::~ExtendedKalmanFilter
            ((ExtendedKalmanFilter<4U,_3U,_1U> *)
             (a.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
             + 0xf));
  return RVar6;
}

Assistant:

double testExtendedKalmanFilterLTV()
{
    const static unsigned kmax=1000;

    typedef stateObservation::compileTime::ExtendedKalmanFilter<4,3,1> ekf;


    struct KalmanFunctorLTV:
                public ekf::DynamicsFunctorBase
    {

public:
        KalmanFunctorLTV()
        {
            s_=ekf::StateVector::Random();
            n_=ekf::MeasureVector::Random();

            for (unsigned i=0;i<=kmax;++i)
            {
                a.push_back( ekf::Amatrix::Random()*0.5 );
                c.push_back( ekf::Cmatrix::Random() );
            }

        }

        virtual ekf::StateVector stateDynamics(const ekf::StateVector& x, const ekf::InputVector& u, unsigned k)
        {
            ekf::StateVector xk1;
            unsigned kk=std::min(k,kmax);
            xk1=a[kk]*x+(u*u.transpose())[0]*s_;

            return xk1;
        }

        virtual ekf::MeasureVector measureDynamics(const ekf::StateVector& x, const ekf::InputVector &u,unsigned k)
        {
            (void)k;//unused
            (void)u;//unused

            ekf::MeasureVector yk;
            unsigned kk=std::min(k,kmax);
            yk=c[kk]*x+(u*u.transpose())[0]*n_;
            return yk;
        }

        std::vector<ekf::Amatrix,Eigen::aligned_allocator<ekf::Amatrix> > a;
        std::vector<ekf::Cmatrix,Eigen::aligned_allocator<ekf::Cmatrix> > c;
private:
        ekf::StateVector s_;
        ekf::MeasureVector n_;
    };


    ekf f;

    ekf::Amatrix a;
    KalmanFunctorLTV func;

    f.setFunctor(&func);



    ekf::StateVector xk[kmax+1];
    ekf::MeasureVector yk[kmax];
    ekf::InputVector uk[kmax+1];

    ekf::StateVector x=ekf::StateVector::Zero();



    boost::lagged_fibonacci1279 gen_;

    ekf::Rmatrix r1=ekf::Rmatrix::Random()*0.01;

    ekf::Qmatrix q1=ekf::Qmatrix::Random()*0.01;

    ekf::Rmatrix r(r1*r1.transpose());
    ekf::Qmatrix q(q1*q1.transpose());

    xk[0]=x;
    uk[0]=ekf::InputVector::Random();

    for (unsigned k=1; k<=kmax; ++k)
    {
        ekf::StateVector v;
        for (unsigned i=0;i<ekf::stateSize;++i)
        {
            boost::normal_distribution<> g(0, 1);
            v[i]=g(gen_);
        }
        v=q1*v;

        ekf::MeasureVector w;
        for (unsigned i=0;i<ekf::measureSize;++i)
        {
            boost::normal_distribution<> g(0, 1);
            w[i]=g(gen_);
        }
        w=r1*w;

        uk[k]=ekf::InputVector::Random();

        x=func.stateDynamics(x,uk[k-1],k-1)+v;

        xk[k]=x;
        yk[k-1]=func.measureDynamics(x,uk[k],k)+w;

    }

    ekf::StateVector xh=ekf::StateVector::Random();

    f.setState(xh,0);

    ekf::Pmatrix p=ekf::Pmatrix::Zero();



    f.setStateCovariance(p);

    f.setR(r);
    f.setQ(q);

    f.setInput(uk[0],0);

    for (unsigned i=0;i<ekf::stateSize;++i)
    {
        p(i,i)=xh[i];
    }
    p=p*p.transpose();

    ekf::StateVector dx=ekf::StateVector::Constant(1)*1e-8;

    unsigned i;
    for (i=1;i<=kmax;++i)
    {
        f.setMeasurement(yk[i-1],i);
        f.setInput(uk[i],i);


        ekf::Amatrix a=f.getAMatrixFD(dx);
        ekf::Cmatrix c= f.getCMatrixFD(dx);

        f.setA(a);
        f.setC(c);

        xh=f.getEstimatedState(i);
    }

    ekf::StateVector error(xh-xk[kmax]);

    return error.norm();

}